

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaReadAig.c
# Opt level: O3

Aig_Man_t * Ioa_ReadAiger(char *pFileName,int fCheck)

{
  int nFileSize;
  FILE *__stream;
  char *pcVar1;
  Aig_Man_t *pAVar2;
  size_t sVar3;
  char *pcVar4;
  
  nFileSize = Ioa_FileSize(pFileName);
  __stream = fopen(pFileName,"rb");
  pcVar1 = (char *)malloc((long)nFileSize);
  fread(pcVar1,(long)nFileSize,1,__stream);
  fclose(__stream);
  pAVar2 = Ioa_ReadAigerFromMemory(pcVar1,nFileSize,fCheck);
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  if (pAVar2 != (Aig_Man_t *)0x0) {
    pcVar1 = Ioa_FileNameGeneric(pFileName);
    if (pAVar2->pName != (char *)0x0) {
      free(pAVar2->pName);
      pAVar2->pName = (char *)0x0;
    }
    if (pcVar1 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      sVar3 = strlen(pcVar1);
      pcVar4 = (char *)malloc(sVar3 + 1);
      strcpy(pcVar4,pcVar1);
    }
    pAVar2->pName = pcVar4;
    if (pFileName == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      sVar3 = strlen(pFileName);
      pcVar4 = (char *)malloc(sVar3 + 1);
      strcpy(pcVar4,pFileName);
    }
    pAVar2->pSpec = pcVar4;
    if (pcVar1 != (char *)0x0) {
      free(pcVar1);
    }
  }
  return pAVar2;
}

Assistant:

Aig_Man_t * Ioa_ReadAiger( char * pFileName, int fCheck )
{
    FILE * pFile;
    Aig_Man_t * pNew;
    char * pName, * pContents;
    int nFileSize, RetValue;

    // read the file into the buffer
    nFileSize = Ioa_FileSize( pFileName );
    pFile = fopen( pFileName, "rb" );
    pContents = ABC_ALLOC( char, nFileSize );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    fclose( pFile );

    pNew = Ioa_ReadAigerFromMemory( pContents, nFileSize, fCheck );
    ABC_FREE( pContents );
    if ( pNew )
    {
        pName = Ioa_FileNameGeneric( pFileName );
        ABC_FREE( pNew->pName );
        pNew->pName = Abc_UtilStrsav( pName );
        pNew->pSpec = Abc_UtilStrsav( pFileName );
        ABC_FREE( pName );
    }
    return pNew;
}